

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_nthVal(CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RCX;
  CVmObjLookupTable *in_RDX;
  long in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  vm_val_t *in_stack_ffffffffffffffd0;
  
  if ((getp_nthVal(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_nthVal(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_nthVal::desc,1);
    __cxa_guard_release(&getp_nthVal(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    CVmBif::pop_long_val();
    get_nth_ele(in_RDX,in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_RDI);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_nthVal(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the nth value */
    get_nth_ele(vmg_ 0, retval, self, CVmBif::pop_long_val(vmg0_));

    /* handled */
    return TRUE;
}